

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.cpp
# Opt level: O3

void InsertSort(int *A,int n)

{
  int iVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (1 < n) {
    uVar3 = 1;
    do {
      iVar1 = A[uVar3];
      uVar4 = uVar3;
      do {
        if (A[uVar4 - 1 & 0xffffffff] <= iVar1) goto LAB_00101609;
        A[uVar4] = A[uVar4 - 1 & 0xffffffff];
        bVar2 = 1 < (long)uVar4;
        uVar4 = uVar4 - 1;
      } while (bVar2);
      uVar4 = 0;
LAB_00101609:
      A[(int)uVar4] = iVar1;
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void InsertSort(int A[], int n) {
    int j,temp;
    for(int i = 1; i < n; ++i) {
        temp = A[i];  //将待插入关键字暂存于temp中
        j = i-1;
        //下面这个while循环完成了从待排序关键字之前的关键字扫描，如果大于待排关键字则后移一位
        while(j>=0 && temp<A[j]) {
            A[j+1] = A[j];
            --j;
        }
        A[j+1] = temp;   //找到插入位置就插入
    }
}